

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O2

shared_ptr<GenApi_3_4::CNodeMapRef> __thiscall
rcg::allocNodeMap(rcg *this,shared_ptr<const_rcg::GenTLWrapper> *gentl,void *port,CPort *cport,
                 char *xml)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  GC_ERROR GVar3;
  int iVar4;
  CNodeMapRef *this_00;
  unsigned_long_long uVar5;
  GenTLException *pGVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<GenApi_3_4::CNodeMapRef> sVar7;
  allocator local_879;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  size_t length;
  shared_ptr<GenApi_3_4::CNodeMapRef> nodemap;
  INFO_DATATYPE type;
  uint32_t n;
  string name;
  string url;
  string saddress;
  size_t size;
  string slength;
  gcstring portname;
  size_type local_7b8 [63];
  stringstream in;
  ulong local_5b8;
  char tmp [1024];
  
  this_00 = (CNodeMapRef *)operator_new(0x68);
  GenICam_3_4::gcstring::gcstring((gcstring *)tmp,"Device");
  GenApi_3_4::CNodeMapRef::CNodeMapRef(this_00,(gcstring *)tmp);
  std::__shared_ptr<GenApi_3_4::CNodeMapRef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<GenApi_3_4::CNodeMapRef,void>
            ((__shared_ptr<GenApi_3_4::CNodeMapRef,(__gnu_cxx::_Lock_policy)2> *)&nodemap,this_00);
  GenICam_3_4::gcstring::~gcstring((gcstring *)tmp);
  n = 0;
  GVar3 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->GCGetNumPortURLs)(port,&n);
  if (GVar3 != 0) {
    pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)tmp,"allocNodeMap()",(allocator *)&portname);
    GenTLException::GenTLException(pGVar6,(string *)tmp,gentl);
    __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  if (n == 0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    goto LAB_00111d2c;
  }
  memset(tmp,0,0x400);
  size = 0x400;
  GVar3 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->GCGetPortURLInfo)(port,0,0,&type,tmp,&size);
  if (GVar3 != 0) {
    pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&portname,"allocNodeMap()",(allocator *)&in);
    GenTLException::GenTLException(pGVar6,(string *)&portname,gentl);
    __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  std::__cxx11::string::string((string *)&url,tmp,(allocator *)&portname);
  anon_unknown_4::toLower((string *)&portname,&url,0,6);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &portname,"local:");
  std::__cxx11::string::~string((string *)&portname);
  if (bVar2) {
    std::__cxx11::string::compare((ulong)&url,6,(char *)0x3);
    std::__cxx11::string::substr((ulong)&portname,(ulong)&url);
    std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)&portname,_S_out|_S_in);
    std::__cxx11::string::~string((string *)&portname);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    saddress._M_dataplus._M_p = (pointer)&saddress.field_2;
    saddress._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    saddress.field_2._M_local_buf[0] = '\0';
    slength._M_dataplus._M_p = (pointer)&slength.field_2;
    slength._M_string_length = 0;
    slength.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&in,(string *)&name,';');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&in,(string *)&saddress,';');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&in,(string *)&slength,';');
    uVar5 = std::__cxx11::stoull(&saddress,(size_t *)0x0,0x10);
    length = std::__cxx11::stoull(&slength,(size_t *)0x0,0x10);
    buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)operator_new__(length + 1);
    GVar3 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->GCReadPort)
                      (port,uVar5,
                       (void *)buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>
                               ._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                               super__Head_base<0UL,_char_*,_false>._M_head_impl,&length);
    if (GVar3 != 0) {
      pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&portname,"allocNodeMap()",&local_879);
      GenTLException::GenTLException(pGVar6,(string *)&portname,gentl);
      __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    *(undefined1 *)
     ((long)buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl + length) = 0;
    if (xml != (char *)0x0) {
      if (*xml == '\0') {
        xml = (char *)name._M_dataplus;
      }
      std::ofstream::ofstream(&portname,xml,_S_bin);
      (**(code **)(local_7b8[0] + 0x60))
                (local_7b8,
                 buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl,length);
      std::ofstream::~ofstream(&portname);
    }
    if (name._M_string_length < 5) {
LAB_00111c2f:
      GenICam_3_4::gcstring::gcstring
                (&portname,
                 (char *)buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                         super__Head_base<0UL,_char_*,_false>._M_head_impl);
      GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromString
                (&(nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>,&portname);
      GenICam_3_4::gcstring::~gcstring(&portname);
    }
    else {
      anon_unknown_4::toLower((string *)&portname,&name,name._M_string_length - 4,4);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &portname,".zip");
      std::__cxx11::string::~string((string *)&portname);
      if (!bVar2) goto LAB_00111c2f;
      GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPData
                (&(nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>,
                 (void *)buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                         super__Head_base<0UL,_char_*,_false>._M_head_impl,length);
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&buffer);
    std::__cxx11::string::~string((string *)&slength);
    std::__cxx11::string::~string((string *)&saddress);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::stringstream::~stringstream((stringstream *)&in);
  }
  else {
    anon_unknown_4::toLower((string *)&portname,&url,0,5);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &portname,"file:");
    std::__cxx11::string::~string((string *)&portname);
    if (!bVar2) {
      pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                     "allocNodeMap(): Cannot interpret URL: ",&url);
      std::__cxx11::string::string((string *)&portname,_in,(allocator *)&name);
      GenTLException::GenTLException(pGVar6,(string *)&portname);
      __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    std::__cxx11::string::compare((ulong)&url,5,(char *)0x3);
    std::__cxx11::string::substr((ulong)&in,(ulong)&url);
    if (local_5b8 < 5) {
LAB_00111bec:
      GenICam_3_4::gcstring::gcstring(&portname,_in);
      GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromFile
                (&(nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>,&portname);
    }
    else {
      anon_unknown_4::toLower((string *)&portname,(string *)&in,local_5b8 - 4,4);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &portname,".zip");
      std::__cxx11::string::~string((string *)&portname);
      if (!bVar2) goto LAB_00111bec;
      GenICam_3_4::gcstring::gcstring(&portname,_in);
      GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPFile
                (&(nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>,&portname);
    }
    GenICam_3_4::gcstring::~gcstring(&portname);
    std::__cxx11::string::~string((string *)&in);
  }
  size = 0x400;
  GVar3 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->GCGetPortInfo)(port,0xc,&type,tmp,&size);
  if (GVar3 != 0) {
    pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&portname,"allocNodeMap()",(allocator *)&in);
    GenTLException::GenTLException(pGVar6,(string *)&portname,gentl);
    __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  GenICam_3_4::gcstring::gcstring(&portname,tmp);
  iVar4 = (*((nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[0xc])
                    (nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,cport,&portname);
  if ((char)iVar4 == '\0') {
    pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&saddress,"allocNodeMap(): Cannot connect port: ",(allocator *)&slength);
    std::operator+(&name,&saddress,tmp);
    std::__cxx11::string::string((string *)&in,name._M_dataplus._M_p,(allocator *)&length);
    GenTLException::GenTLException(pGVar6,(string *)&in);
    __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  GenICam_3_4::gcstring::~gcstring(&portname);
  std::__cxx11::string::~string((string *)&url);
  _Var1 = nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this =
       nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
LAB_00111d2c:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar7.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<GenApi_3_4::CNodeMapRef>)
         sVar7.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenApi::CNodeMapRef> allocNodeMap(std::shared_ptr<const GenTLWrapper> gentl,
                                                  void *port, CPort *cport, const char *xml)
{
  std::shared_ptr<GenApi::CNodeMapRef> nodemap(new GenApi::CNodeMapRef());

  try
  {
    // get number of URLS that the given port provides

    uint32_t n=0;
    if (gentl->GCGetNumPortURLs(port, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    if (n == 0)
    {
      return std::shared_ptr<GenApi::CNodeMapRef>();
    }

    // get the first URL

    GenTL::INFO_DATATYPE type;
    char tmp[1024]="";
    size_t size=sizeof(tmp);

    if (gentl->GCGetPortURLInfo(port, 0, GenTL::URL_INFO_URL, &type, tmp, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    // interpret the URL and load XML File

    std::string url=tmp;
    if (toLower(url, 0, 6) == "local:")
    {
      // interpret local URL

      size_t i=6;
      if (url.compare(i, 3, "///") == 0)
      {
        i+=3;
      }

      std::stringstream in(url.substr(i));
      std::string name, saddress, slength;

      std::getline(in, name, ';');
      std::getline(in, saddress, ';');
      std::getline(in, slength, ';');

      uint64_t address=std::stoull(saddress, 0, 16);
      size_t length=static_cast<size_t>(std::stoull(slength, 0, 16));

      // read XML or ZIP from registers

      std::unique_ptr<char[]> buffer(new char[length+1]);

      if (gentl->GCReadPort(port, address, buffer.get(), &length) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("allocNodeMap()", gentl);
      }

      buffer.get()[length]='\0';

      // store XML file

      if (xml != 0)
      {
        if (xml[0] == '\0')
        {
          xml=name.c_str();
        }

        std::ofstream out(xml, std::ios::binary);

        out.rdbuf()->sputn(buffer.get(), static_cast<std::streamsize>(length));
      }

      // load XML or ZIP from registers

      if (name.size() > 4 && toLower(name, name.size()-4, 4) == ".zip")
      {
        nodemap->_LoadXMLFromZIPData(buffer.get(), length);
      }
      else
      {
        GENICAM_NAMESPACE::gcstring sxml=buffer.get();
        nodemap->_LoadXMLFromString(sxml);
      }
    }
    else if (toLower(url, 0, 5) == "file:")
    {
      // interpret local URL

      size_t i=5;
      if (url.compare(i, 3, "///") == 0)
      {
        i+=3;
      }

      std::string name=url.substr(i);

      // load XML or ZIP from file

      if (name.size() > 4 && toLower(name, name.size()-4, 4) == ".zip")
      {
        GENICAM_NAMESPACE::gcstring file=name.c_str();
        nodemap->_LoadXMLFromZIPFile(file);
      }
      else
      {
        GENICAM_NAMESPACE::gcstring file=name.c_str();
        nodemap->_LoadXMLFromFile(file);
      }
    }
    else
    {
      throw GenTLException(("allocNodeMap(): Cannot interpret URL: "+url).c_str());
    }

    // get port name

    size=sizeof(tmp);

    if (gentl->GCGetPortInfo(port, GenTL::PORT_INFO_PORTNAME, &type, tmp, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    GENICAM_NAMESPACE::gcstring portname=tmp;
    if (!nodemap->_Connect(cport, portname))
    {
      throw GenTLException((std::string("allocNodeMap(): Cannot connect port: ")+tmp).c_str());
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    throw GenTLException(ex.what());
  }

  return nodemap;
}